

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.h
# Opt level: O2

void __thiscall FTerrainDef::FTerrainDef(FTerrainDef *this,FTerrainDef *param_2)

{
  double dVar1;
  undefined8 uVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  
  (this->Name).Index = (param_2->Name).Index;
  iVar3 = param_2->DamageAmount;
  this->Splash = param_2->Splash;
  this->DamageAmount = iVar3;
  (this->DamageMOD).Index = (param_2->DamageMOD).Index;
  uVar4 = *(undefined4 *)&param_2->field_0x14;
  dVar1 = param_2->FootClip;
  uVar2 = *(undefined8 *)((long)&param_2->FootClip + 4);
  iVar3 = param_2->WalkStepTics;
  iVar5 = param_2->RunStepTics;
  this->DamageTimeMask = param_2->DamageTimeMask;
  *(undefined4 *)&this->field_0x14 = uVar4;
  this->FootClip = dVar1;
  *(undefined8 *)((long)&this->FootClip + 4) = uVar2;
  this->WalkStepTics = iVar3;
  this->RunStepTics = iVar5;
  (this->LeftStepSound).ID = (param_2->LeftStepSound).ID;
  (this->RightStepSound).ID = (param_2->RightStepSound).ID;
  uVar2 = *(undefined8 *)((long)&param_2->Friction + 4);
  *(undefined8 *)&this->IsLiquid = *(undefined8 *)&param_2->IsLiquid;
  *(undefined8 *)((long)&this->Friction + 4) = uVar2;
  *(undefined4 *)((long)&this->MoveFactor + 4) = *(undefined4 *)((long)&param_2->MoveFactor + 4);
  return;
}

Assistant:

FName (const FName &other) { Index = other.Index; }